

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean get_sos(j_decompress_ptr cinfo)

{
  byte bVar1;
  byte bVar2;
  jpeg_source_mgr *pjVar3;
  jpeg_error_mgr *pjVar4;
  boolean bVar5;
  uint uVar6;
  uint uVar7;
  int *_mp_1;
  int *_mp;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  jpeg_component_info *compptr;
  int cc;
  int c;
  int n;
  int ci;
  int i;
  INT32 length;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->src;
  bytes_in_buffer = (size_t)pjVar3->next_input_byte;
  _mp = (int *)pjVar3->bytes_in_buffer;
  if (cinfo->marker->saw_SOF == 0) {
    cinfo->err->msg_code = 0x40;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar3->next_input_byte;
    _mp = (int *)pjVar3->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  bVar1 = *(byte *)bytes_in_buffer;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar3->next_input_byte;
    _mp = (int *)pjVar3->bytes_in_buffer;
  }
  _mp = (int *)((long)_mp + -1);
  bVar2 = *(byte *)bytes_in_buffer;
  bytes_in_buffer = bytes_in_buffer + 1;
  if (_mp == (int *)0x0) {
    bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
    if (bVar5 == 0) {
      return 0;
    }
    bytes_in_buffer = (size_t)pjVar3->next_input_byte;
    _mp = (int *)pjVar3->bytes_in_buffer;
  }
  uVar6 = (uint)*(byte *)bytes_in_buffer;
  cinfo->err->msg_code = 0x69;
  (cinfo->err->msg_parm).i[0] = uVar6;
  (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
  if ((((ulong)bVar2 + (ulong)bVar1 * 0x100 != (long)(int)(uVar6 * 2 + 6)) || (4 < uVar6)) ||
     ((uVar6 == 0 && (cinfo->progressive_mode == 0)))) {
    cinfo->err->msg_code = 0xc;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  cinfo->comps_in_scan = uVar6;
  n = 0;
  do {
    bytes_in_buffer = bytes_in_buffer + 1;
    _mp = (int *)((long)_mp + -1);
    if ((int)uVar6 <= n) {
      if (_mp == (int *)0x0) {
        bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
        if (bVar5 == 0) {
          return 0;
        }
        bytes_in_buffer = (size_t)pjVar3->next_input_byte;
        _mp = (int *)pjVar3->bytes_in_buffer;
      }
      _mp = (int *)((long)_mp + -1);
      cinfo->Ss = (uint)*(byte *)bytes_in_buffer;
      bytes_in_buffer = bytes_in_buffer + 1;
      if (_mp == (int *)0x0) {
        bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
        if (bVar5 == 0) {
          return 0;
        }
        bytes_in_buffer = (size_t)pjVar3->next_input_byte;
        _mp = (int *)pjVar3->bytes_in_buffer;
      }
      _mp = (int *)((long)_mp + -1);
      cinfo->Se = (uint)*(byte *)bytes_in_buffer;
      bytes_in_buffer = bytes_in_buffer + 1;
      if (_mp == (int *)0x0) {
        bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
        if (bVar5 == 0) {
          return 0;
        }
        bytes_in_buffer = (size_t)pjVar3->next_input_byte;
        _mp = (int *)pjVar3->bytes_in_buffer;
      }
      bVar1 = *(byte *)bytes_in_buffer;
      cinfo->Ah = (int)(uint)bVar1 >> 4;
      cinfo->Al = bVar1 & 0xf;
      pjVar4 = cinfo->err;
      (pjVar4->msg_parm).i[0] = cinfo->Ss;
      (pjVar4->msg_parm).i[1] = cinfo->Se;
      (pjVar4->msg_parm).i[2] = cinfo->Ah;
      (pjVar4->msg_parm).i[3] = cinfo->Al;
      cinfo->err->msg_code = 0x6b;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      cinfo->marker->next_restart_num = 0;
      if (uVar6 != 0) {
        cinfo->input_scan_number = cinfo->input_scan_number + 1;
      }
      pjVar3->next_input_byte = (JOCTET *)(bytes_in_buffer + 1);
      pjVar3->bytes_in_buffer = (long)_mp - 1;
      return 1;
    }
    if (_mp == (int *)0x0) {
      bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
      if (bVar5 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar3->next_input_byte;
      _mp = (int *)pjVar3->bytes_in_buffer;
    }
    _mp = (int *)((long)_mp + -1);
    uVar7 = (uint)*(byte *)bytes_in_buffer;
    bytes_in_buffer = bytes_in_buffer + 1;
    if (_mp == (int *)0x0) {
      bVar5 = (*pjVar3->fill_input_buffer)(cinfo);
      if (bVar5 == 0) {
        return 0;
      }
      bytes_in_buffer = (size_t)pjVar3->next_input_byte;
      _mp = (int *)pjVar3->bytes_in_buffer;
    }
    bVar1 = *(byte *)bytes_in_buffer;
    c = 0;
    datasrc = (jpeg_source_mgr *)cinfo->comp_info;
    for (; c < cinfo->num_components; c = c + 1) {
      if (uVar7 == *(uint *)&datasrc->next_input_byte) goto LAB_0038ad76;
      datasrc = (jpeg_source_mgr *)&datasrc[1].resync_to_restart;
    }
    cinfo->err->msg_code = 4;
    (cinfo->err->msg_parm).i[0] = uVar7;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_0038ad76:
    cinfo->cur_comp_info[n] = (jpeg_component_info *)datasrc;
    *(int *)((long)&datasrc->init_source + 4) = (int)(uint)bVar1 >> 4;
    *(uint *)&datasrc->fill_input_buffer = bVar1 & 0xf;
    pjVar4 = cinfo->err;
    (pjVar4->msg_parm).i[0] = uVar7;
    (pjVar4->msg_parm).i[1] = *(int *)((long)&datasrc->init_source + 4);
    (pjVar4->msg_parm).i[2] = *(int *)&datasrc->fill_input_buffer;
    cinfo->err->msg_code = 0x6a;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    n = n + 1;
  } while( true );
}

Assistant:

LOCAL(boolean)
get_sos (j_decompress_ptr cinfo)
/* Process a SOS marker */
{
  INT32 length;
  int i, ci, n, c, cc;
  jpeg_component_info * compptr;
  INPUT_VARS(cinfo);

  if (! cinfo->marker->saw_SOF)
    ERREXIT(cinfo, JERR_SOS_NO_SOF);

  INPUT_2BYTES(cinfo, length, return FALSE);

  INPUT_BYTE(cinfo, n, return FALSE); /* Number of components */

  TRACEMS1(cinfo, 1, JTRC_SOS, n);

  if (length != (n * 2 + 6) || n > MAX_COMPS_IN_SCAN ||
      (n == 0 && !cinfo->progressive_mode))
      /* pseudo SOS marker only allowed in progressive mode */
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  cinfo->comps_in_scan = n;

  /* Collect the component-spec parameters */

  for (i = 0; i < n; i++) {
    INPUT_BYTE(cinfo, cc, return FALSE);
    INPUT_BYTE(cinfo, c, return FALSE);
    
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      if (cc == compptr->component_id)
	goto id_found;
    }

    ERREXIT1(cinfo, JERR_BAD_COMPONENT_ID, cc);

  id_found:

    cinfo->cur_comp_info[i] = compptr;
    compptr->dc_tbl_no = (c >> 4) & 15;
    compptr->ac_tbl_no = (c     ) & 15;
    
    TRACEMS3(cinfo, 1, JTRC_SOS_COMPONENT, cc,
	     compptr->dc_tbl_no, compptr->ac_tbl_no);
  }

  /* Collect the additional scan parameters Ss, Se, Ah/Al. */
  INPUT_BYTE(cinfo, c, return FALSE);
  cinfo->Ss = c;
  INPUT_BYTE(cinfo, c, return FALSE);
  cinfo->Se = c;
  INPUT_BYTE(cinfo, c, return FALSE);
  cinfo->Ah = (c >> 4) & 15;
  cinfo->Al = (c     ) & 15;

  TRACEMS4(cinfo, 1, JTRC_SOS_PARAMS, cinfo->Ss, cinfo->Se,
	   cinfo->Ah, cinfo->Al);

  /* Prepare to scan data & restart markers */
  cinfo->marker->next_restart_num = 0;

  /* Count another (non-pseudo) SOS marker */
  if (n) cinfo->input_scan_number++;

  INPUT_SYNC(cinfo);
  return TRUE;
}